

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

void lddmc_gc_mark_serialize_CALL(WorkerP *w,Task *__dq_head)

{
  avl_node_t *paVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  size_t __size;
  
  paVar1 = lddmc_ser_set;
  if (lddmc_ser_set == (avl_node_t *)0x0) {
    __size = 0x10;
  }
  else {
    __size = (ulong)(lddmc_ser_set->height + 1) * 8 + 8;
  }
  plVar2 = (long *)malloc(__size);
  *plVar2 = 0;
  plVar2[1] = (long)paVar1;
  do {
    if (plVar2[1] == 0) {
      lVar5 = 0;
    }
    else {
      lVar3 = *plVar2;
      plVar4 = (long *)plVar2[lVar3 + 1];
      if (plVar4 != (long *)0x0) {
        do {
          plVar4 = (long *)*plVar4;
          plVar2[lVar3 + 2] = (long)plVar4;
          lVar3 = lVar3 + 1;
        } while (plVar4 != (long *)0x0);
        *plVar2 = lVar3;
      }
      lVar5 = plVar2[lVar3];
      lVar6 = *(long *)(lVar5 + 8);
      if (lVar6 == 0) {
        lVar3 = *plVar2;
        do {
          if (lVar3 == 1) {
            lVar3 = 0;
            break;
          }
          lVar6 = lVar3 + -1;
          plVar4 = plVar2 + lVar3;
          lVar3 = lVar3 + -1;
        } while (*plVar4 == *(long *)(plVar2[lVar6] + 8));
        *plVar2 = lVar3;
        lVar6 = 0;
      }
      plVar2[lVar3 + 1] = lVar6;
    }
    if (lVar5 == 0) {
      return;
    }
    lddmc_gc_mark_rec_CALL(w,__dq_head,*(MDD *)(lVar5 + 0x18));
  } while( true );
}

Assistant:

VOID_TASK_IMPL_0(lddmc_gc_mark_serialize)
{
    struct lddmc_ser *s;
    avl_iter_t *it = lddmc_ser_iter(lddmc_ser_set);

    /* Iterate through nodes in serialization */
    while ((s=lddmc_ser_iter_next(it))) {
        CALL(lddmc_gc_mark_rec, s->mdd);
    }
}